

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_parse_result *
pugi::impl::anon_unknown_0::load_file_impl
          (xml_document_struct *doc,FILE *file,uint options,xml_encoding encoding,
          char_t **out_buffer)

{
  xml_parse_status xVar1;
  xml_encoding encoding_00;
  xml_document_struct *doc_00;
  xml_node_struct *root;
  undefined4 in_ECX;
  FILE *in_RDX;
  xml_parse_result *in_RDI;
  undefined4 in_R8D;
  xml_encoding real_encoding;
  size_t read_size;
  char *contents;
  size_t max_suffix_size;
  xml_parse_status size_status;
  size_t size;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined8 in_stack_ffffffffffffff80;
  xml_parse_result *size_00;
  undefined4 in_stack_ffffffffffffffb0;
  xml_encoding in_stack_ffffffffffffffd0;
  
  if (in_RDX == (FILE *)0x0) {
    make_parse_result((xml_parse_status)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    size_00 = in_RDI;
  }
  else {
    size_00 = in_RDI;
    xVar1 = get_file_size((FILE *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                          (size_t *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    if (xVar1 == status_ok) {
      doc_00 = (xml_document_struct *)
               (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)(1);
      if (doc_00 == (xml_document_struct *)0x0) {
        make_parse_result((xml_parse_status)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      }
      else {
        root = (xml_node_struct *)fread(doc_00,1,0,in_RDX);
        if (root == (xml_node_struct *)0x0) {
          encoding_00 = get_buffer_encoding((xml_encoding)in_stack_ffffffffffffff80,
                                            (void *)CONCAT44(in_stack_ffffffffffffff7c,
                                                             in_stack_ffffffffffffff78),
                                            CONCAT44(in_stack_ffffffffffffff74,
                                                     in_stack_ffffffffffffff70));
          zero_terminate_buffer(doc_00,0,encoding_00);
          load_buffer_impl(doc_00,root,(void *)CONCAT44(encoding_00,in_stack_ffffffffffffffb0),
                           (size_t)size_00,(uint)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffd0,
                           SUB81((ulong)in_RDI >> 0x18,0),SUB81((ulong)in_RDI >> 0x10,0),
                           (char_t **)CONCAT44(in_ECX,in_R8D));
        }
        else {
          (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                    (doc_00);
          make_parse_result((xml_parse_status)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                            CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        }
      }
    }
    else {
      make_parse_result((xml_parse_status)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
  }
  return size_00;
}

Assistant:

PUGI__FN xml_parse_result load_file_impl(xml_document_struct* doc, FILE* file, unsigned int options, xml_encoding encoding, char_t** out_buffer)
	{
		if (!file) return make_parse_result(status_file_not_found);

		// get file size (can result in I/O errors)
		size_t size = 0;
		xml_parse_status size_status = get_file_size(file, size);
		if (size_status != status_ok) return make_parse_result(size_status);

		size_t max_suffix_size = sizeof(char_t);

		// allocate buffer for the whole file
		char* contents = static_cast<char*>(xml_memory::allocate(size + max_suffix_size));
		if (!contents) return make_parse_result(status_out_of_memory);

		// read file in memory
		size_t read_size = fread(contents, 1, size, file);

		if (read_size != size)
		{
			xml_memory::deallocate(contents);
			return make_parse_result(status_io_error);
		}

		xml_encoding real_encoding = get_buffer_encoding(encoding, contents, size);

		return load_buffer_impl(doc, doc, contents, zero_terminate_buffer(contents, size, real_encoding), options, real_encoding, true, true, out_buffer);
	}